

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.cc
# Opt level: O3

void __thiscall trng::mt19937_64::mt19937_64(mt19937_64 *this,unsigned_long s)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  memset((this->S).mt + 1,0,0x9b8);
  (this->S).mt[0] = s;
  lVar1 = 1;
  lVar2 = 3;
  do {
    lVar3 = (s >> 0x3e ^ s) * 0x5851f42d4c957f2d;
    s = lVar3 + lVar1;
    (this->S).mt[lVar2 + -2] = (lVar2 + lVar3) - 2;
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x13a);
  (this->S).mti = 0x138;
  return;
}

Assistant:

mt19937_64::mt19937_64(unsigned long s) { seed(s); }